

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_callback_cancel_nolock_(event_base *base,event_callback *evcb,int even_if_finalizing)

{
  ushort uVar1;
  event *ev;
  int blocking;
  int even_if_finalizing_local;
  event_callback *evcb_local;
  event_base *base_local;
  
  if (((evcb->evcb_flags & 0x40U) == 0) || (even_if_finalizing != 0)) {
    if ((evcb->evcb_flags & 0x80U) == 0) {
      uVar1 = evcb->evcb_flags & 0x28;
      if ((evcb->evcb_flags & 0x28U) != 0) {
        if (uVar1 == 8) {
          event_queue_remove_active(base,evcb);
          return 0;
        }
        if (uVar1 != 0x20) {
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                     ,0xc0d,"0","event_callback_cancel_nolock_");
        }
        event_queue_remove_active_later(base,evcb);
      }
      base_local._4_4_ = 0;
    }
    else {
      ev = event_callback_to_event(evcb);
      blocking = 2;
      if (even_if_finalizing != 0) {
        blocking = 3;
      }
      base_local._4_4_ = event_del_nolock_(ev,blocking);
    }
  }
  else {
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
event_callback_cancel_nolock_(struct event_base *base,
    struct event_callback *evcb, int even_if_finalizing)
{
	if ((evcb->evcb_flags & EVLIST_FINALIZING) && !even_if_finalizing)
		return 0;

	if (evcb->evcb_flags & EVLIST_INIT)
		return event_del_nolock_(event_callback_to_event(evcb),
		    even_if_finalizing ? EVENT_DEL_EVEN_IF_FINALIZING : EVENT_DEL_AUTOBLOCK);

	switch ((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
	default:
	case EVLIST_ACTIVE|EVLIST_ACTIVE_LATER:
		EVUTIL_ASSERT(0);
		break;
	case EVLIST_ACTIVE:
		/* We get different kinds of events, add them together */
		event_queue_remove_active(base, evcb);
		return 0;
	case EVLIST_ACTIVE_LATER:
		event_queue_remove_active_later(base, evcb);
		break;
	case 0:
		break;
	}

	return 0;
}